

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O1

int archive_utility_string_sort_helper(char **strings,uint n)

{
  char *__s2;
  uint uVar1;
  char **ppcVar2;
  char **ppcVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  uint uVar7;
  ulong uVar8;
  uint n_00;
  char **local_58;
  char **local_50;
  ulong local_48;
  
  iVar4 = 0;
  if (1 < n) {
    __s2 = *strings;
    n_00 = 0;
    uVar8 = 1;
    local_50 = (char **)0x0;
    local_58 = (char **)0x0;
    local_48 = 0;
    do {
      iVar4 = strcmp(strings[uVar8],__s2);
      if (iVar4 < 0) {
        ppcVar6 = (char **)realloc(local_58,(ulong)(n_00 + 1) * 8);
        uVar1 = n_00 + 1;
        uVar7 = n_00;
        ppcVar2 = ppcVar6;
        ppcVar3 = local_50;
        if (ppcVar6 == (char **)0x0) {
          free(local_50);
LAB_00165c54:
          free(local_58);
          return -0x1e;
        }
      }
      else {
        uVar7 = (uint)local_48;
        local_48 = (ulong)(uVar7 + 1);
        ppcVar6 = (char **)realloc(local_50,local_48 * 8);
        uVar1 = n_00;
        ppcVar2 = local_58;
        ppcVar3 = ppcVar6;
        if (ppcVar6 == (char **)0x0) {
          free(local_50);
          goto LAB_00165c54;
        }
      }
      local_50 = ppcVar3;
      local_58 = ppcVar2;
      n_00 = uVar1;
      ppcVar6[uVar7] = strings[uVar8];
      uVar8 = uVar8 + 1;
    } while (n != uVar8);
    iVar5 = archive_utility_string_sort_helper(local_58,n_00);
    if (n_00 != 0) {
      uVar8 = 0;
      do {
        strings[uVar8] = local_58[uVar8];
        uVar8 = uVar8 + 1;
      } while (n_00 != uVar8);
    }
    free(local_58);
    strings[n_00] = __s2;
    iVar4 = archive_utility_string_sort_helper(local_50,(uint)local_48);
    if ((uint)local_48 != 0) {
      uVar8 = 0;
      do {
        strings[n_00 + 1 + (int)uVar8] = local_50[uVar8];
        uVar8 = uVar8 + 1;
      } while (local_48 != uVar8);
    }
    free(local_50);
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int
archive_utility_string_sort_helper(char **strings, unsigned int n)
{
	unsigned int i, lesser_count, greater_count;
	char **lesser, **greater, **tmp, *pivot;
	int retval1, retval2;

	/* A list of 0 or 1 elements is already sorted */
	if (n <= 1)
		return (ARCHIVE_OK);

	lesser_count = greater_count = 0;
	lesser = greater = NULL;
	pivot = strings[0];
	for (i = 1; i < n; i++)
	{
		if (strcmp(strings[i], pivot) < 0)
		{
			lesser_count++;
			tmp = (char **)realloc(lesser,
				lesser_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			lesser = tmp;
			lesser[lesser_count - 1] = strings[i];
		}
		else
		{
			greater_count++;
			tmp = (char **)realloc(greater,
				greater_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			greater = tmp;
			greater[greater_count - 1] = strings[i];
		}
	}

	/* quicksort(lesser) */
	retval1 = archive_utility_string_sort_helper(lesser, lesser_count);
	for (i = 0; i < lesser_count; i++)
		strings[i] = lesser[i];
	free(lesser);

	/* pivot */
	strings[lesser_count] = pivot;

	/* quicksort(greater) */
	retval2 = archive_utility_string_sort_helper(greater, greater_count);
	for (i = 0; i < greater_count; i++)
		strings[lesser_count + 1 + i] = greater[i];
	free(greater);

	return (retval1 < retval2) ? retval1 : retval2;
}